

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O2

int Timidity::read_config_file(char *name,bool ismain)

{
  int *piVar1;
  ToneBankElement *pTVar2;
  int iVar3;
  uint uVar4;
  int preset;
  int keynote;
  int iVar5;
  uint uVar6;
  FileReader *pFVar7;
  undefined4 extraout_var;
  char *pcVar8;
  undefined8 *puVar9;
  char *pcVar10;
  uint i;
  uint uVar11;
  ulong uVar12;
  ToneBank *local_4a0;
  uint local_48c;
  int lumpnum;
  char *local_468;
  FCommandLine w;
  char tmp [1024];
  
  iVar3 = -1;
  if (read_config_file::rcf_count < 0x33) {
    if (ismain) {
      pathExpander._16_4_ = 0;
    }
    pFVar7 = PathExpander::openFileReader((PathExpander *)pathExpander,name,&lumpnum);
    if (pFVar7 != (FileReader *)0x0) {
      if (ismain) {
        if (lumpnum < 1) {
          pathExpander._16_4_ = 2;
        }
        else {
          pathExpander._16_4_ = 1;
          PathExpander::clearPathlist((PathExpander *)pathExpander);
        }
      }
      local_4a0 = (ToneBank *)0x0;
      local_468 = "%s: line %d: syntax error\n";
      local_48c = 0;
      while (iVar3 = (*(pFVar7->super_FileReaderBase)._vptr_FileReaderBase[5])(pFVar7,tmp,0x400),
            CONCAT44(extraout_var,iVar3) != 0) {
        FCommandLine::FCommandLine(&w,tmp,true);
        uVar4 = FCommandLine::argc(&w);
        local_48c = local_48c + 1;
        if (uVar4 != 0) {
          pcVar8 = FCommandLine::operator[](&w,0);
          iVar3 = strcmp(pcVar8,"#extension");
          if (iVar3 == 0) {
            FCommandLine::Shift(&w);
            uVar4 = uVar4 - 1;
          }
          else {
            pcVar8 = FCommandLine::operator[](&w,0);
            if (*pcVar8 == '#') goto LAB_003727f0;
          }
          i = 0;
          uVar6 = 0;
          if (0 < (int)uVar4) {
            uVar6 = uVar4;
          }
          while ((uVar11 = uVar4, uVar6 != i &&
                 (pcVar8 = FCommandLine::operator[](&w,i), uVar11 = i, *pcVar8 != '#'))) {
            i = i + 1;
          }
          pcVar8 = FCommandLine::operator[](&w,0);
          iVar3 = strcmp(pcVar8,"comm");
          if (iVar3 != 0) {
            pcVar8 = FCommandLine::operator[](&w,0);
            iVar3 = strcmp(pcVar8,"HTTPproxy");
            if (iVar3 != 0) {
              pcVar8 = FCommandLine::operator[](&w,0);
              iVar3 = strcmp(pcVar8,"FTPproxy");
              if (iVar3 != 0) {
                pcVar8 = FCommandLine::operator[](&w,0);
                iVar3 = strcmp(pcVar8,"mailaddr");
                if (iVar3 != 0) {
                  pcVar8 = FCommandLine::operator[](&w,0);
                  iVar3 = strcmp(pcVar8,"opt");
                  if (iVar3 != 0) {
                    pcVar8 = FCommandLine::operator[](&w,0);
                    iVar3 = strcmp(pcVar8,"timeout");
                    if (iVar3 != 0) {
                      pcVar8 = FCommandLine::operator[](&w,0);
                      iVar3 = strcmp(pcVar8,"copydrumset");
                      if (iVar3 != 0) {
                        pcVar8 = FCommandLine::operator[](&w,0);
                        iVar3 = strcmp(pcVar8,"copybank");
                        if (iVar3 != 0) {
                          pcVar8 = FCommandLine::operator[](&w,0);
                          iVar3 = strcmp(pcVar8,"undef");
                          if (iVar3 != 0) {
                            pcVar8 = FCommandLine::operator[](&w,0);
                            iVar3 = strcmp(pcVar8,"altassign");
                            if (iVar3 != 0) {
                              pcVar8 = FCommandLine::operator[](&w,0);
                              iVar3 = strcmp(pcVar8,"soundfont");
                              if (iVar3 == 0) {
                                if ((int)uVar11 < 2) {
                                  pcVar8 = "%s: line %d: No soundfont given\n";
                                  goto LAB_00372bf0;
                                }
                                if (uVar11 != 2) {
                                  pcVar8 = FCommandLine::operator[](&w,2);
                                  iVar3 = strcmp(pcVar8,"remove");
                                  if (iVar3 == 0) {
                                    pcVar8 = FCommandLine::operator[](&w,1);
                                    font_remove(pcVar8);
                                    goto LAB_003727f0;
                                  }
                                }
                                for (iVar3 = 2; iVar3 < (int)uVar11; iVar3 = iVar3 + 1) {
                                  pcVar8 = FCommandLine::operator[](&w,iVar3);
                                  pcVar8 = strchr(pcVar8,0x3d);
                                  if (pcVar8 == (char *)0x0) {
                                    pcVar8 = FCommandLine::operator[](&w,iVar3);
                                    Printf("%s: line %d: bad soundfont option %s\n",name,
                                           (ulong)local_48c,pcVar8);
                                    goto LAB_00372bcf;
                                  }
                                }
                                pcVar8 = FCommandLine::operator[](&w,1);
                                font_add(pcVar8,0);
                              }
                              else {
                                pcVar8 = FCommandLine::operator[](&w,0);
                                iVar3 = strcmp(pcVar8,"font");
                                if (iVar3 == 0) {
                                  if ((int)uVar11 < 3) {
LAB_00372c37:
                                    Printf(local_468,name,(ulong)local_48c);
LAB_00372bcf:
                                    (*(pFVar7->super_FileReaderBase)._vptr_FileReaderBase[1])();
LAB_00372bda:
                                    FCommandLine::~FCommandLine(&w);
                                    return -2;
                                  }
                                  pcVar8 = FCommandLine::operator[](&w,1);
                                  iVar3 = strcmp(pcVar8,"exclude");
                                  if (iVar3 == 0) {
                                    iVar3 = 0xfe;
                                    uVar4 = 2;
                                  }
                                  else {
                                    pcVar8 = FCommandLine::operator[](&w,1);
                                    iVar3 = strcmp(pcVar8,"order");
                                    if (iVar3 != 0) {
                                      local_468 = 
                                      "%s: line %d: font subcommand must be \'order\' or \'exclude\'\n"
                                      ;
                                      goto LAB_00372c37;
                                    }
                                    pcVar8 = FCommandLine::operator[](&w,2);
                                    iVar3 = atoi(pcVar8);
                                    uVar4 = 3;
                                  }
                                  uVar6 = 3;
                                  keynote = -1;
                                  iVar5 = keynote;
                                  if (uVar4 < uVar11) {
                                    pcVar8 = FCommandLine::operator[](&w,uVar4);
                                    uVar6 = uVar4 + 1;
                                    iVar5 = atoi(pcVar8);
                                  }
                                  if (uVar6 < uVar11) {
                                    pcVar8 = FCommandLine::operator[](&w,uVar6);
                                    uVar6 = uVar6 + 1;
                                    preset = atoi(pcVar8);
                                  }
                                  else {
                                    preset = -1;
                                  }
                                  if (uVar6 < uVar11) {
                                    pcVar8 = FCommandLine::operator[](&w,uVar6);
                                    keynote = atoi(pcVar8);
                                  }
                                  if (iVar5 != 0x80) {
                                    keynote = preset;
                                    preset = iVar5;
                                  }
                                  font_order(iVar3,(uint)(iVar5 == 0x80),preset,keynote);
                                }
                                else {
                                  pcVar8 = FCommandLine::operator[](&w,0);
                                  iVar3 = strcmp(pcVar8,"progbase");
                                  if (iVar3 != 0) {
                                    pcVar8 = FCommandLine::operator[](&w,0);
                                    iVar3 = strcmp(pcVar8,"map");
                                    if (iVar3 != 0) {
                                      pcVar8 = FCommandLine::operator[](&w,0);
                                      iVar3 = strcmp(pcVar8,"dir");
                                      if (iVar3 == 0) {
                                        if ((int)uVar11 < 2) {
                                          pcVar8 = "%s: line %d: No directory given\n";
                                          goto LAB_00372bf0;
                                        }
                                        for (uVar4 = 1; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                                          pcVar8 = FCommandLine::operator[](&w,uVar4);
                                          PathExpander::addToPathlist
                                                    ((PathExpander *)pathExpander,pcVar8);
                                        }
                                      }
                                      else {
                                        pcVar8 = FCommandLine::operator[](&w,0);
                                        iVar3 = strcmp(pcVar8,"source");
                                        if (iVar3 != 0) {
                                          pcVar8 = FCommandLine::operator[](&w,0);
                                          iVar3 = strcmp(pcVar8,"default");
                                          if (iVar3 == 0) {
                                            if (uVar11 == 2) {
                                              pcVar8 = FCommandLine::operator[](&w,1);
                                              FString::operator=((FString *)&def_instr_name,pcVar8);
                                              goto LAB_003727f0;
                                            }
                                            pcVar8 = 
                                            "%s: line %d: Must specify exactly one patch name\n";
                                          }
                                          else {
                                            pcVar8 = FCommandLine::operator[](&w,0);
                                            iVar3 = strcmp(pcVar8,"drumset");
                                            if (iVar3 == 0) {
                                              if ((int)uVar11 < 2) {
                                                pcVar8 = "%s: line %d: No drum set number given\n";
                                              }
                                              else {
                                                pcVar8 = FCommandLine::operator[](&w,1);
                                                uVar4 = atoi(pcVar8);
                                                if (uVar4 < 0x80) {
                                                  uVar12 = (ulong)uVar4;
                                                  local_4a0 = (ToneBank *)(&drumset)[uVar12];
                                                  if (local_4a0 == (ToneBank *)0x0) {
                                                    local_4a0 = (ToneBank *)operator_new(0x408);
                                                    ToneBank::ToneBank(local_4a0);
                                                    puVar9 = &drumset;
LAB_003727ec:
                                                    puVar9[uVar12] = local_4a0;
                                                  }
                                                  goto LAB_003727f0;
                                                }
                                                pcVar8 = 
                                                "%s: line %d: Drum set must be between 0 and 127\n";
                                              }
                                            }
                                            else {
                                              pcVar8 = FCommandLine::operator[](&w,0);
                                              iVar3 = strcmp(pcVar8,"bank");
                                              if (iVar3 == 0) {
                                                if ((int)uVar11 < 2) {
                                                  pcVar8 = "%s: line %d: No bank number given\n";
                                                }
                                                else {
                                                  pcVar8 = FCommandLine::operator[](&w,1);
                                                  uVar4 = atoi(pcVar8);
                                                  if (uVar4 < 0x80) {
                                                    uVar12 = (ulong)uVar4;
                                                    local_4a0 = (ToneBank *)(&tonebank)[uVar12];
                                                    if (local_4a0 == (ToneBank *)0x0) {
                                                      local_4a0 = (ToneBank *)operator_new(0x408);
                                                      ToneBank::ToneBank(local_4a0);
                                                      puVar9 = &tonebank;
                                                      goto LAB_003727ec;
                                                    }
                                                    goto LAB_003727f0;
                                                  }
                                                  pcVar8 = 
                                                  "%s: line %d: Tone bank must be between 0 and 127\n"
                                                  ;
                                                }
                                              }
                                              else if ((((int)uVar11 < 2) ||
                                                       (pcVar8 = FCommandLine::operator[](&w,0),
                                                       *pcVar8 < '0')) ||
                                                      (pcVar8 = FCommandLine::operator[](&w,0),
                                                      '9' < *pcVar8)) {
                                                pcVar8 = "%s: line %d: syntax error\n";
                                              }
                                              else {
                                                pcVar8 = FCommandLine::operator[](&w,0);
                                                uVar4 = atoi(pcVar8);
                                                if (uVar4 < 0x80) {
                                                  if (local_4a0 != (ToneBank *)0x0) {
                                                    pTVar2 = local_4a0->tone;
                                                    piVar1 = &pTVar2[uVar4].note;
                                                    *piVar1 = -1;
                                                    piVar1[1] = -1;
                                                    piVar1[2] = -1;
                                                    piVar1[3] = -1;
                                                    *(undefined8 *)
                                                     ((long)&pTVar2[uVar4].fontpreset + 3) =
                                                         0xffffffffffffffff;
                                                    pcVar8 = FCommandLine::operator[](&w,1);
                                                    iVar3 = strcmp(pcVar8,"%font");
                                                    if (iVar3 == 0) {
                                                      pcVar8 = FCommandLine::operator[](&w,2);
                                                      FString::operator=(&local_4a0->tone[uVar4].
                                                                          name,pcVar8);
                                                      pcVar8 = FCommandLine::operator[](&w,3);
                                                      iVar3 = atoi(pcVar8);
                                                      local_4a0->tone[uVar4].fontbank = iVar3;
                                                      pcVar8 = FCommandLine::operator[](&w,4);
                                                      iVar3 = atoi(pcVar8);
                                                      pTVar2 = local_4a0->tone;
                                                      pTVar2[uVar4].fontpreset = iVar3;
                                                      iVar3 = 5;
                                                      if (5 < uVar11) {
                                                        if (pTVar2[uVar4].fontbank == 0x80) {
LAB_00372881:
                                                          pcVar8 = FCommandLine::operator[](&w,5);
                                                          iVar3 = atoi(pcVar8);
                                                          local_4a0->tone[uVar4].fontnote = iVar3;
                                                          iVar3 = 6;
                                                        }
                                                        else {
                                                          pcVar8 = FCommandLine::operator[](&w,5);
                                                          iVar3 = 5;
                                                          if ('/' < *pcVar8) {
                                                            pcVar8 = FCommandLine::operator[](&w,5);
                                                            iVar3 = 5;
                                                            if (*pcVar8 < ':') goto LAB_00372881;
                                                          }
                                                        }
                                                      }
                                                      pcVar8 = FCommandLine::operator[](&w,2);
                                                      font_add(pcVar8,0xfe);
                                                    }
                                                    else {
                                                      pcVar8 = FCommandLine::operator[](&w,1);
                                                      FString::operator=(&local_4a0->tone[uVar4].
                                                                          name,pcVar8);
                                                      iVar3 = 2;
                                                    }
                                                    for (; iVar3 < (int)uVar11; iVar3 = iVar3 + 1) {
                                                      pcVar8 = FCommandLine::operator[](&w,iVar3);
                                                      pcVar8 = strchr(pcVar8,0x3d);
                                                      if (pcVar8 == (char *)0x0) {
LAB_00372c02:
                                                        pcVar8 = FCommandLine::operator[](&w,iVar3);
                                                        Printf("%s: line %d: bad patch option %s\n",
                                                               name,(ulong)local_48c,pcVar8);
                                                        goto LAB_00372bcf;
                                                      }
                                                      *pcVar8 = '\0';
                                                      pcVar10 = FCommandLine::operator[](&w,iVar3);
                                                      iVar5 = strcmp(pcVar10,"amp");
                                                      if (iVar5 != 0) {
                                                        pcVar10 = FCommandLine::operator[](&w,iVar3)
                                                        ;
                                                        pcVar8 = pcVar8 + 1;
                                                        iVar5 = strcmp(pcVar10,"note");
                                                        if (iVar5 == 0) {
                                                          uVar6 = atoi(pcVar8);
                                                          if ((0x7f < uVar6) ||
                                                             ((byte)(*pcVar8 - 0x3aU) < 0xf6)) {
                                                            pcVar8 = 
                                                  "%s: line %d: note must be between 0 and 127\n";
                                                  goto LAB_00372bf0;
                                                  }
                                                  local_4a0->tone[uVar4].note = uVar6;
                                                  }
                                                  else {
                                                    pcVar10 = FCommandLine::operator[](&w,iVar3);
                                                    iVar5 = strcmp(pcVar10,"pan");
                                                    if (iVar5 == 0) {
                                                      iVar5 = strcmp(pcVar8,"center");
                                                      uVar6 = 0x40;
                                                      if (iVar5 != 0) {
                                                        iVar5 = strcmp(pcVar8,"left");
                                                        if (iVar5 == 0) {
LAB_00372ad7:
                                                          uVar6 = 0;
                                                          if (*pcVar8 != '-' &&
                                                              (byte)(*pcVar8 - 0x3aU) < 0xf6) {
LAB_00372cc1:
                                                            pcVar8 = 
                                                  "%s: line %d: panning must be left, right, center, or between -100 and 100\n"
                                                  ;
                                                  goto LAB_00372bf0;
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar8,"right");
                                                    uVar6 = 0x7f;
                                                    if (iVar5 != 0) {
                                                      iVar5 = atoi(pcVar8);
                                                      uVar6 = (iVar5 * 100 + 10000) / 0x9d;
                                                      if (0x7f < uVar6) goto LAB_00372cc1;
                                                      if (iVar5 * 100 + 0x27acU < 0x139)
                                                      goto LAB_00372ad7;
                                                    }
                                                  }
                                                  }
                                                  local_4a0->tone[uVar4].pan = uVar6;
                                                  }
                                                  else {
                                                    pcVar10 = FCommandLine::operator[](&w,iVar3);
                                                    iVar5 = strcmp(pcVar10,"keep");
                                                    if (iVar5 == 0) {
                                                      iVar5 = strcmp(pcVar8,"env");
                                                      if (iVar5 == 0) {
                                                        local_4a0->tone[uVar4].strip_envelope = '\0'
                                                        ;
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar8,"loop");
                                                        if (iVar5 != 0) {
                                                          pcVar8 = 
                                                  "%s: line %d: keep must be env or loop\n";
                                                  goto LAB_00372bf0;
                                                  }
                                                  local_4a0->tone[uVar4].strip_loop = '\0';
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = FCommandLine::operator[](&w,iVar3);
                                                    iVar5 = strcmp(pcVar10,"strip");
                                                    if (iVar5 != 0) goto LAB_00372c02;
                                                    iVar5 = strcmp(pcVar8,"env");
                                                    if (iVar5 == 0) {
                                                      local_4a0->tone[uVar4].strip_envelope = '\x01'
                                                      ;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar8,"loop");
                                                      if (iVar5 == 0) {
                                                        local_4a0->tone[uVar4].strip_loop = '\x01';
                                                      }
                                                      else {
                                                        iVar5 = strcmp(pcVar8,"tail");
                                                        if (iVar5 != 0) {
                                                          pcVar8 = 
                                                  "%s: line %d: strip must be env, loop, or tail\n";
                                                  goto LAB_00372bf0;
                                                  }
                                                  local_4a0->tone[uVar4].strip_tail = '\x01';
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_003727f0;
                                                  }
                                                  pcVar8 = 
                                                  "%s: line %d: Must specify tone bank or drum set before assignment\n"
                                                  ;
                                                }
                                                else {
                                                  pcVar8 = 
                                                  "%s: line %d: Program must be between 0 and 127\n"
                                                  ;
                                                }
                                              }
                                            }
                                          }
LAB_00372bf0:
                                          Printf(pcVar8,name,(ulong)local_48c);
                                          goto LAB_00372bcf;
                                        }
                                        if ((int)uVar11 < 2) {
                                          Printf("%s: line %d: No file name given\n",name,
                                                 (ulong)local_48c);
                                          goto LAB_00372bda;
                                        }
                                        for (uVar4 = 1; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                                          read_config_file::rcf_count =
                                               read_config_file::rcf_count + 1;
                                          pcVar8 = FCommandLine::operator[](&w,uVar4);
                                          read_config_file(pcVar8,false);
                                          read_config_file::rcf_count =
                                               read_config_file::rcf_count + -1;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_003727f0:
        FCommandLine::~FCommandLine(&w);
      }
      (*(pFVar7->super_FileReaderBase)._vptr_FileReaderBase[1])();
      iVar3 = 0;
    }
  }
  else {
    Printf("Timidity: Probable source loop in configuration files\n");
  }
  return iVar3;
}

Assistant:

static int read_config_file(const char *name, bool ismain)
{
	FileReader *fp;
	char tmp[1024], *cp;
	ToneBank *bank = NULL;
	int i, j, k, line = 0, words;
	static int rcf_count = 0;
	int lumpnum;

	if (rcf_count > 50)
	{
		Printf("Timidity: Probable source loop in configuration files\n");
		return (-1);
	}

	if (ismain) pathExpander.openmode = PathExpander::OM_FILEORLUMP;

	if (!(fp = pathExpander.openFileReader(name, &lumpnum)))
		return -1;

	if (ismain)
	{
		if (lumpnum > 0)
		{
			pathExpander.openmode = PathExpander::OM_LUMP;
			pathExpander.clearPathlist();	// when reading from a PK3 we don't want to use any external path
		}
		else
		{
			pathExpander.openmode = PathExpander::OM_FILE;
		}
	}

	while (fp->Gets(tmp, sizeof(tmp)))
	{
		line++;
		FCommandLine w(tmp, true);
		words = w.argc();
		if (words == 0) continue;

		/* Originally the TiMidity++ extensions were prefixed like this */
		if (strcmp(w[0], "#extension") == 0)
		{
			w.Shift();
			words--;
		}
		else if (*w[0] == '#')
		{
			continue;
		}

		for (i = 0; i < words; ++i)
		{
			if (*w[i] == '#')
			{
				words = i;
				break;
			}
		}

		/*
		 * TiMidity++ adds a number of extensions to the config file format.
		 * Many of them are completely irrelevant to SDL_sound, but at least
		 * we shouldn't choke on them.
		 *
		 * Unfortunately the documentation for these extensions is often quite
		 * vague, gramatically strange or completely absent.
		 */
		if (
			!strcmp(w[0], "comm")			/* "comm" program second        */
			|| !strcmp(w[0], "HTTPproxy")	/* "HTTPproxy" hostname:port    */
			|| !strcmp(w[0], "FTPproxy")	/* "FTPproxy" hostname:port     */
			|| !strcmp(w[0], "mailaddr")	/* "mailaddr" your-mail-address */
			|| !strcmp(w[0], "opt")			/* "opt" timidity-options       */
			)
		{
			/*
			* + "comm" sets some kind of comment -- the documentation is too
			*   vague for me to understand at this time.
			* + "HTTPproxy", "FTPproxy" and "mailaddr" are for reading data
			*   over a network, rather than from the file system.
			* + "opt" specifies default options for TiMidity++.
			*
			* These are all quite useless for our version of TiMidity, so
			* they can safely remain no-ops.
			*/
		}
		else if (!strcmp(w[0], "timeout"))	/* "timeout" program second */
		{
			/*
			* Specifies a timeout value of the program. A number of seconds
			* before TiMidity kills the note. This may be useful to implement
			* later, but I don't see any urgent need for it.
			*/
			//Printf("FIXME: Implement \"timeout\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "copydrumset")	/* "copydrumset" drumset */
			|| !strcmp(w[0], "copybank"))		/* "copybank" bank       */
		{
			/*
			* Copies all the settings of the specified drumset or bank to
			* the current drumset or bank. May be useful later, but not a
			* high priority.
			*/
			//Printf("FIXME: Implement \"%s\" in TiMidity config.\n", w[0]);
		}
		else if (!strcmp(w[0], "undef"))		/* "undef" progno */
		{
			/*
			* Undefines the tone "progno" of the current tone bank (or
			* drum set?). Not a high priority.
			*/
			//Printf("FIXME: Implement \"undef\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "altassign")) /* "altassign" prog1 prog2 ... */
		{
			/*
			* Sets the alternate assign for drum set. Whatever that's
			* supposed to mean.
			*/
			//Printf("FIXME: Implement \"altassign\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "soundfont"))
		{
			/*
			* "soundfont" sf_file "remove"
			* "soundfont" sf_file ["order=" order] ["cutoff=" cutoff]
			*                     ["reso=" reso] ["amp=" amp]
			*/
			if (words < 2)
			{
				Printf("%s: line %d: No soundfont given\n", name, line);
				delete fp;
				return -2;
			}
			if (words > 2 && !strcmp(w[2], "remove"))
			{
				font_remove(w[1]);
			}
			else
			{
				int order = 0;

				for (i = 2; i < words; ++i)
				{
					if (!(cp = strchr(w[i], '=')))
					{
						Printf("%s: line %d: bad soundfont option %s\n", name, line, w[i]);
						delete fp;
						return -2;
					}
				}
				font_add(w[1], order);
			}
		}
		else if (!strcmp(w[0], "font"))
		{
			/*
			* "font" "exclude" bank preset keynote
			* "font" "order" order bank preset keynote
			*/
			int order, drum = -1, bank = -1, instr = -1;

			if (words < 3)
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}

			if (!strcmp(w[1], "exclude"))
			{
				order = 254;
				i = 2;
			}
			else if (!strcmp(w[1], "order"))
			{
				order = atoi(w[2]);
				i = 3;
			}
			else
			{
				Printf("%s: line %d: font subcommand must be 'order' or 'exclude'\n", name, line);
				delete fp;
				return -2;
			}
			if (i < words)
			{
				drum = atoi(w[i++]);
			}
			if (i < words)
			{
				bank = atoi(w[i++]);
			}
			if (i < words)
			{
				instr = atoi(w[i++]);
			}
			if (drum != 128)
			{
				instr = bank;
				bank = drum;
				drum = 0;
			}
			else
			{
				drum = 1;
			}
			font_order(order, drum, bank, instr);
		}
		else if (!strcmp(w[0], "progbase"))
		{
			/*
			* The documentation for this makes absolutely no sense to me, but
			* apparently it sets some sort of base offset for tone numbers.
			* Why anyone would want to do this is beyond me.
			*/
			//Printf("FIXME: Implement \"progbase\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "map")) /* "map" name set1 elem1 set2 elem2 */
		{
			/*
			* This extension is the one we will need to implement, as it is
			* used by the "eawpats". Unfortunately I cannot find any
			* documentation whatsoever for it, but it looks like it's used
			* for remapping one instrument to another somehow.
			*/
			//Printf("FIXME: Implement \"map\" in TiMidity config.\n");
		}

		/* Standard TiMidity config */

		else if (!strcmp(w[0], "dir"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No directory given\n", name, line);
				delete fp;
				return -2;
			}
			for (i = 1; i < words; i++)
				pathExpander.addToPathlist(w[i]);
		}
		else if (!strcmp(w[0], "source"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No file name given\n", name, line);
				return -2;
			}
			for (i=1; i<words; i++)
			{
				rcf_count++;
				read_config_file(w[i], false);
				rcf_count--;
			}
		}
		else if (!strcmp(w[0], "default"))
		{
			if (words != 2)
			{
				Printf("%s: line %d: Must specify exactly one patch name\n", name, line);
				delete fp;
				return -2;
			}
			def_instr_name = w[1];
		}
		else if (!strcmp(w[0], "drumset"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No drum set number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Drum set must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (drumset[i] == NULL)
			{
				drumset[i] = new ToneBank;
			}
			bank = drumset[i];
		}
		else if (!strcmp(w[0], "bank"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No bank number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Tone bank must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (tonebank[i] == NULL)
			{
				tonebank[i] = new ToneBank;
			}
			bank = tonebank[i];
		}
		else
		{
			if ((words < 2) || (*w[0] < '0' || *w[0] > '9'))
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[0]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Program must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (bank == NULL)
			{
				Printf("%s: line %d: Must specify tone bank or drum set before assignment\n", name, line);
				delete fp;
				return -2;
			}
			bank->tone[i].note = bank->tone[i].pan =
				bank->tone[i].fontbank = bank->tone[i].fontpreset =
				bank->tone[i].fontnote = bank->tone[i].strip_loop = 
				bank->tone[i].strip_envelope = bank->tone[i].strip_tail = -1;

			if (!strcmp(w[1], "%font"))
			{
				bank->tone[i].name = w[2];
				bank->tone[i].fontbank = atoi(w[3]);
				bank->tone[i].fontpreset = atoi(w[4]);
				if (words > 5 && (bank->tone[i].fontbank == 128 || (w[5][0] >= '0' && w[5][0] <= '9')))
				{
					bank->tone[i].fontnote = atoi(w[5]);
					j = 6;
				}
				else
				{
					j = 5;
				}
				font_add(w[2], 254);
			}
			else
			{
				bank->tone[i].name = w[1];
				j = 2;
			}

			for (; j<words; j++)
			{
				if (!(cp=strchr(w[j], '=')))
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
				*cp++ = 0;
				if (!strcmp(w[j], "amp"))
				{
					/* Ignored */
				}
				else if (!strcmp(w[j], "note"))
				{
					k = atoi(cp);
					if ((k < 0 || k > 127) || (*cp < '0' || *cp > '9'))
					{
						Printf("%s: line %d: note must be between 0 and 127\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].note = k;
				}
				else if (!strcmp(w[j], "pan"))
				{
					if (!strcmp(cp, "center"))
						k = 64;
					else if (!strcmp(cp, "left"))
						k = 0;
					else if (!strcmp(cp, "right"))
						k = 127;
					else
						k = ((atoi(cp)+100) * 100) / 157;
					if ((k < 0 || k > 127) ||
						(k == 0 && *cp != '-' && (*cp < '0' || *cp > '9')))
					{
						Printf("%s: line %d: panning must be left, right, "
							"center, or between -100 and 100\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].pan = k;
				}
				else if (!strcmp(w[j], "keep"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 0;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 0;
					else
					{
						Printf("%s: line %d: keep must be env or loop\n", name, line);
						delete fp;
						return -2;
					}
				}
				else if (!strcmp(w[j], "strip"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 1;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 1;
					else if (!strcmp(cp, "tail"))
						bank->tone[i].strip_tail = 1;
					else
					{
						Printf("%s: line %d: strip must be env, loop, or tail\n", name, line);
						delete fp;
						return -2;
					}
				}
				else
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
			}
		}
	}
	/*
	if (ferror(fp))
	{
		Printf("Can't read %s: %s\n", name, strerror(errno));
		close_file(fp);
		return -2;
	}
	*/
	delete fp;
	return 0;
}